

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

void REVcreate_split_action_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  EVstone EVar1;
  CMFormat target_list;
  CManager in_RDX;
  CMFormat f;
  EVstone ret;
  EVcreate_split_action_request *request;
  EV_int_response response;
  FMStructDescList in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  target_list = CMlookup_format((CManager_conflict)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                in_stack_ffffffffffffffb8);
  if (target_list == (CMFormat)0x0) {
    target_list = INT_CMregister_format
                            (in_RDX,(FMStructDescList)
                                    CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  EVar1 = EVcreate_split_action
                    ((CManager_conflict)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (EVstone *)target_list);
  CMwrite((CMConnection)CONCAT44(EVar1,*(undefined4 *)&in_RDX->transports),(CMFormat)in_RDX,
          (void *)CONCAT44(EVar1,in_stack_ffffffffffffffc0));
  return;
}

Assistant:

static void
REVcreate_split_action_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_int_response response;
    EVcreate_split_action_request *request = (EVcreate_split_action_request *) data;
    EVstone ret;
    CMFormat f = CMlookup_format(conn->cm, EV_int_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_int_response_formats);
    }
    ret = EVcreate_split_action(cm, request->target_list);
    response.ret = (int)ret;
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}